

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall
QtPrivate::QCalendarModel::cellForDate(QCalendarModel *this,QDate date,int *row,int *column)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  qint64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (row != (int *)0x0 || column != (int *)0x0) {
    if (row != (int *)0x0) {
      *row = -1;
    }
    if (column != (int *)0x0) {
      *column = -1;
    }
    local_40 = (qint64)referenceDate(this);
    if (local_40 + 0xb69eeff91fU < 0x16d3e147974) {
      iVar2 = columnForFirstOfMonth(this,(QDate)local_40);
      iVar3 = QDate::daysTo((QDate)&local_40);
      uVar1 = this->m_firstColumn;
      iVar4 = QDate::day(&local_40,*(undefined8 *)&this->m_calendar);
      iVar4 = iVar3 + iVar2 + ~uVar1 + iVar4;
      uVar5 = iVar4 % 7;
      uVar1 = iVar4 % 7 + 7;
      if (-1 < (int)uVar5) {
        uVar1 = uVar5;
      }
      uVar5 = (uint)(iVar2 <= this->m_firstColumn) + iVar4 / 7 + ((int)uVar5 >> 0x1f);
      if (uVar1 < 7 && uVar5 < 6) {
        if (row != (int *)0x0) {
          *row = uVar5 + this->m_firstRow;
        }
        if (column != (int *)0x0) {
          *column = uVar1 + this->m_firstColumn;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::cellForDate(QDate date, int *row, int *column) const
{
    if (!row && !column)
        return;

    if (row)
        *row = -1;
    if (column)
        *column = -1;

    const QDate refDate = referenceDate();
    if (!refDate.isValid())
        return;

    const int columnForFirstOfShownMonth = columnForFirstOfMonth(refDate);
    const int requestedPosition = (refDate.daysTo(date) - m_firstColumn +
                                   columnForFirstOfShownMonth + refDate.day(m_calendar) - 1);

    int c = requestedPosition % 7;
    int r = requestedPosition / 7;
    if (c < 0) {
        c += 7;
        r -= 1;
    }

    if (columnForFirstOfShownMonth - m_firstColumn < MinimumDayOffset)
        r += 1;

    if (r < 0 || r > RowCount - 1 || c < 0 || c > ColumnCount - 1)
        return;

    if (row)
        *row = r + m_firstRow;
    if (column)
        *column = c + m_firstColumn;
}